

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O3

void Acec_TreeFindTrees2_rec
               (Vec_Int_t *vAdds,Vec_Int_t *vMap,int iAdd,int Rank,Vec_Int_t *vTree,
               Vec_Bit_t *vFound)

{
  uint uVar1;
  long lVar2;
  
  if ((-1 < iAdd) && (iAdd < vFound->nSize)) {
    uVar1 = vFound->pArray[(uint)iAdd >> 5];
    if ((uVar1 >> (iAdd & 0x1fU) & 1) == 0) {
      vFound->pArray[(uint)iAdd >> 5] = uVar1 | 1 << ((byte)iAdd & 0x1f);
      Vec_IntPush(vTree,iAdd);
      Vec_IntPush(vTree,Rank);
      lVar2 = 0;
      do {
        if (vAdds->nSize <= iAdd * 6 + (int)lVar2) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        Acec_TreeFindTrees_rec
                  (vAdds,vMap,vAdds->pArray[(ulong)(uint)(iAdd * 6) + lVar2],
                   (uint)(lVar2 == 4) + Rank,vTree,vFound);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 5);
    }
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
}

Assistant:

void Acec_TreeFindTrees2_rec( Vec_Int_t * vAdds, Vec_Int_t * vMap, int iAdd, int Rank, Vec_Int_t * vTree, Vec_Bit_t * vFound )
{
    extern void Acec_TreeFindTrees_rec( Vec_Int_t * vAdds, Vec_Int_t * vMap, int iObj, int Rank, Vec_Int_t * vTree, Vec_Bit_t * vFound );
    int k;
    if ( Vec_BitEntry(vFound, iAdd) )
        return;
    Vec_BitWriteEntry( vFound, iAdd, 1 );
    Vec_IntPush( vTree, iAdd );
    Vec_IntPush( vTree, Rank );
    //printf( "Assigning rank %d to (%d:%d).\n", Rank, Vec_IntEntry(vAdds, 6*iAdd+3), Vec_IntEntry(vAdds, 6*iAdd+4) );
    for ( k = 0; k < 5; k++ )
        Acec_TreeFindTrees_rec( vAdds, vMap, Vec_IntEntry(vAdds, 6*iAdd+k), k == 4 ? Rank + 1 : Rank, vTree, vFound );
}